

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportLibraryDependenciesCommand.cxx
# Opt level: O3

bool cmExportLibraryDependenciesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *this;
  pointer pcVar3;
  int iVar4;
  string *psVar5;
  undefined8 uVar6;
  string *local_c0;
  long local_b8;
  code *local_b0 [2];
  string local_a0;
  string *local_98;
  undefined8 local_90;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    local_78._M_unused._M_object = (string *)&local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_b0[0] = local_68;
    uVar6 = local_78._M_unused._0_8_;
    if ((string *)local_78._M_unused._0_8_ == (string *)&local_68) goto LAB_002d4bfb;
  }
  else {
    if ((ulong)((long)pbVar2 - (long)pbVar1) < 0x21) {
      local_a0 = (string)0x0;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)(pbVar1 + 1));
      local_a0 = (string)(iVar4 == 0);
    }
    this = status->Makefile;
    pcVar3 = (pbVar1->_M_dataplus)._M_p;
    local_c0 = (string *)local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar3,pcVar3 + pbVar1->_M_string_length);
    local_90 = 0;
    psVar5 = (string *)operator_new(0x28);
    *(string **)psVar5 = psVar5 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar5,local_c0,local_c0 + local_b8);
    psVar5[0x20] = local_a0;
    local_60 = std::
               _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmExportLibraryDependenciesCommand.cxx:158:5)>
               ::_M_invoke;
    local_78._8_8_ = local_90;
    local_68 = std::
               _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmExportLibraryDependenciesCommand.cxx:158:5)>
               ::_M_manager;
    local_88 = (code *)0x0;
    uStack_80 = 0;
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_38._M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
         (_Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)0x0;
    local_98 = psVar5;
    local_78._M_unused._0_8_ = (undefined8)psVar5;
    cmMakefile::AddGeneratorAction(this,(GeneratorAction *)&local_78);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_38);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,3);
    }
    uVar6 = local_c0;
    if (local_c0 == (string *)local_b0) goto LAB_002d4bfb;
  }
  operator_delete((void *)uVar6,(ulong)(local_b0[0] + 1));
LAB_002d4bfb:
  return pbVar1 != pbVar2;
}

Assistant:

bool cmExportLibraryDependenciesCommand(std::vector<std::string> const& args,
                                        cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& filename = args[0];
  bool const append = args.size() > 1 && args[1] == "APPEND";
  status.GetMakefile().AddGeneratorAction(
    [filename, append](cmLocalGenerator& lg, const cmListFileBacktrace&) {
      FinalAction(*lg.GetMakefile(), filename, append);
    });

  return true;
}